

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t *
Gia_ManMiter(Gia_Man_t *p0,Gia_Man_t *p1,int nInsDup,int fDualOut,int fSeq,int fImplic,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  Gia_Man_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *pVVar7;
  Gia_Man_t *p;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  char *pcVar16;
  
  iVar4 = p0->vCis->nSize;
  if (fSeq == 0) {
    if (iVar4 == p1->vCis->nSize) {
      if (p0->vCos->nSize == p1->vCos->nSize) {
LAB_001e912d:
        pGVar5 = Gia_ManStart(p1->nObjs + p0->nObjs);
        pcVar16 = (char *)malloc(6);
        builtin_strncpy(pcVar16,"miter",6);
        pGVar5->pName = pcVar16;
        Gia_ManFillValue(p0);
        Gia_ManFillValue(p1);
        p0->pObjs->Value = 0;
        p1->pObjs->Value = 0;
        Gia_ManHashAlloc(pGVar5);
        if (fSeq == 0) {
          pVVar7 = p0->vCis;
          if (0 < pVVar7->nSize) {
            lVar15 = 0;
            do {
              iVar4 = pVVar7->pArray[lVar15];
              if (((long)iVar4 < 0) || (p0->nObjs <= iVar4)) goto LAB_001ea07f;
              pGVar1 = p0->pObjs;
              if (pGVar1 == (Gia_Obj_t *)0x0) break;
              pGVar6 = Gia_ManAppendObj(pGVar5);
              uVar10 = *(ulong *)pGVar6;
              *(ulong *)pGVar6 = uVar10 | 0x9fffffff;
              *(ulong *)pGVar6 =
                   uVar10 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(pGVar5->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar2 = pGVar5->pObjs;
              if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_001ea09e;
              Vec_IntPush(pGVar5->vCis,
                          (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
              pGVar2 = pGVar5->pObjs;
              if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_001ea09e;
              pGVar1[iVar4].Value = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
              lVar15 = lVar15 + 1;
              pVVar7 = p0->vCis;
            } while (lVar15 < pVVar7->nSize);
          }
          pVVar7 = p1->vCis;
          uVar10 = (ulong)(uint)pVVar7->nSize;
          if (0 < pVVar7->nSize) {
            lVar15 = 0;
            do {
              iVar4 = pVVar7->pArray[lVar15];
              if (((long)iVar4 < 0) || (p1->nObjs <= iVar4)) goto LAB_001ea07f;
              pGVar1 = p1->pObjs;
              if (pGVar1 == (Gia_Obj_t *)0x0) break;
              if (lVar15 < (int)uVar10 - nInsDup) {
                if (pGVar5->vCis->nSize <= lVar15) goto LAB_001ea0bd;
                iVar14 = pGVar5->vCis->pArray[lVar15];
                if (((long)iVar14 < 0) || (pGVar5->nObjs <= iVar14)) goto LAB_001ea07f;
                pGVar2 = pGVar5->pObjs;
                pGVar6 = (Gia_Obj_t *)((ulong)(pGVar2 + iVar14) & 0xfffffffffffffffe);
                if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_001ea09e;
                iVar8 = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2);
                if (iVar8 * -0x55555555 < 0) goto LAB_001ea11a;
                uVar12 = ((uint)(pGVar2 + iVar14) & 1) + iVar8 * 0x55555556;
              }
              else {
                pGVar6 = Gia_ManAppendObj(pGVar5);
                uVar10 = *(ulong *)pGVar6;
                *(ulong *)pGVar6 = uVar10 | 0x9fffffff;
                *(ulong *)pGVar6 =
                     uVar10 & 0xe0000000ffffffff | 0x9fffffff |
                     (ulong)(pGVar5->vCis->nSize & 0x1fffffff) << 0x20;
                pGVar2 = pGVar5->pObjs;
                if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_001ea09e;
                Vec_IntPush(pGVar5->vCis,
                            (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
                pGVar2 = pGVar5->pObjs;
                if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_001ea09e;
                uVar12 = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
              }
              pGVar1[iVar4].Value = uVar12;
              lVar15 = lVar15 + 1;
              pVVar7 = p1->vCis;
              uVar10 = (ulong)pVVar7->nSize;
            } while (lVar15 < (long)uVar10);
          }
          pVVar7 = p0->vCos;
          if (0 < pVVar7->nSize) {
            lVar15 = 0;
            do {
              iVar4 = pVVar7->pArray[lVar15];
              if (((long)iVar4 < 0) || (p0->nObjs <= iVar4)) goto LAB_001ea07f;
              if (p0->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar1 = p0->pObjs + iVar4;
              Gia_ManMiter_rec(pGVar5,p0,pGVar1 + -(ulong)((uint)*(ulong *)pGVar1 & 0x1fffffff));
              if (p1->vCos->nSize <= lVar15) goto LAB_001ea0bd;
              iVar4 = p1->vCos->pArray[lVar15];
              if (((long)iVar4 < 0) || (p1->nObjs <= iVar4)) goto LAB_001ea07f;
              Gia_ManMiter_rec(pGVar5,p1,
                               p1->pObjs + iVar4 + -(*(ulong *)(p1->pObjs + iVar4) & 0x1fffffff));
              uVar10 = *(ulong *)pGVar1;
              uVar12 = pGVar1[-(uVar10 & 0x1fffffff)].Value;
              if (fDualOut == 0) {
                if (fImplic == 0) {
                  if ((int)uVar12 < 0) goto LAB_001ea0dc;
                  if (p1->vCos->nSize <= lVar15) goto LAB_001ea0bd;
                  iVar4 = p1->vCos->pArray[lVar15];
                  if (((long)iVar4 < 0) || (p1->nObjs <= iVar4)) goto LAB_001ea07f;
                  uVar9 = (uint)*(undefined8 *)(p1->pObjs + iVar4);
                  uVar3 = (p1->pObjs + iVar4)[-(ulong)(uVar9 & 0x1fffffff)].Value;
                  if ((int)uVar3 < 0) goto LAB_001ea0dc;
                  uVar12 = Gia_ManHashXor(pGVar5,(uint)uVar10 >> 0x1d & 1 ^ uVar12,
                                          uVar9 >> 0x1d & 1 ^ uVar3);
                }
                else {
                  if ((int)uVar12 < 0) goto LAB_001ea0dc;
                  lVar11 = (long)p1->vCos->nSize;
                  if (lVar11 - p1->nRegs <= lVar15) goto LAB_001ea0fb;
                  if (lVar11 <= lVar15) goto LAB_001ea0bd;
                  iVar4 = p1->vCos->pArray[lVar15];
                  if (((long)iVar4 < 0) || (p1->nObjs <= iVar4)) goto LAB_001ea07f;
                  uVar9 = (uint)*(undefined8 *)(p1->pObjs + iVar4);
                  uVar3 = (p1->pObjs + iVar4)[-(ulong)(uVar9 & 0x1fffffff)].Value;
                  if ((int)uVar3 < 0) goto LAB_001ea0dc;
                  uVar12 = Gia_ManHashAnd(pGVar5,(uint)uVar10 >> 0x1d & 1 ^ uVar12,
                                          uVar3 ^ uVar9 >> 0x1d & 1 ^ 1);
                }
              }
              else {
                if ((int)uVar12 < 0) goto LAB_001ea0dc;
                Gia_ManAppendCo(pGVar5,(uint)(uVar10 >> 0x1d) & 1 ^ uVar12);
                if (p1->vCos->nSize <= lVar15) goto LAB_001ea0bd;
                iVar4 = p1->vCos->pArray[lVar15];
                if (((long)iVar4 < 0) || (p1->nObjs <= iVar4)) goto LAB_001ea07f;
                uVar3 = (uint)*(undefined8 *)(p1->pObjs + iVar4);
                uVar12 = (p1->pObjs + iVar4)[-(ulong)(uVar3 & 0x1fffffff)].Value;
                if ((int)uVar12 < 0) goto LAB_001ea0dc;
                uVar12 = uVar3 >> 0x1d & 1 ^ uVar12;
              }
              Gia_ManAppendCo(pGVar5,uVar12);
              lVar15 = lVar15 + 1;
              pVVar7 = p0->vCos;
            } while (lVar15 < pVVar7->nSize);
          }
        }
        else {
          pVVar7 = p0->vCis;
          uVar10 = (ulong)(uint)pVVar7->nSize;
          if (p0->nRegs < pVVar7->nSize) {
            lVar15 = 0;
            do {
              if ((int)uVar10 <= lVar15) goto LAB_001ea0bd;
              iVar4 = pVVar7->pArray[lVar15];
              if (((long)iVar4 < 0) || (p0->nObjs <= iVar4)) goto LAB_001ea07f;
              pGVar1 = p0->pObjs;
              if (pGVar1 == (Gia_Obj_t *)0x0) break;
              pGVar6 = Gia_ManAppendObj(pGVar5);
              uVar10 = *(ulong *)pGVar6;
              *(ulong *)pGVar6 = uVar10 | 0x9fffffff;
              *(ulong *)pGVar6 =
                   uVar10 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(pGVar5->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar2 = pGVar5->pObjs;
              if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_001ea09e;
              Vec_IntPush(pGVar5->vCis,
                          (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
              pGVar2 = pGVar5->pObjs;
              if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_001ea09e;
              pGVar1[iVar4].Value = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
              lVar15 = lVar15 + 1;
              pVVar7 = p0->vCis;
              uVar10 = (ulong)pVVar7->nSize;
            } while (lVar15 < (long)(uVar10 - (long)p0->nRegs));
          }
          pVVar7 = p1->vCis;
          uVar12 = pVVar7->nSize;
          uVar13 = (ulong)uVar12;
          uVar3 = uVar12 - p1->nRegs;
          uVar10 = (ulong)uVar3;
          if (uVar3 != 0 && p1->nRegs <= (int)uVar12) {
            lVar15 = 0;
            do {
              if ((int)uVar13 <= lVar15) goto LAB_001ea0bd;
              iVar4 = pVVar7->pArray[lVar15];
              if (((long)iVar4 < 0) || (p1->nObjs <= iVar4)) goto LAB_001ea07f;
              pGVar1 = p1->pObjs;
              if (pGVar1 == (Gia_Obj_t *)0x0) break;
              if (lVar15 < (int)uVar10 - nInsDup) {
                lVar11 = (long)pGVar5->vCis->nSize;
                if (lVar11 - pGVar5->nRegs <= lVar15) {
                  __assert_fail("v < Gia_ManPiNum(p)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
                }
                if (lVar11 <= lVar15) goto LAB_001ea0bd;
                iVar14 = pGVar5->vCis->pArray[lVar15];
                if (((long)iVar14 < 0) || (pGVar5->nObjs <= iVar14)) goto LAB_001ea07f;
                pGVar2 = pGVar5->pObjs;
                pGVar6 = (Gia_Obj_t *)((ulong)(pGVar2 + iVar14) & 0xfffffffffffffffe);
                if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_001ea09e;
                iVar8 = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2);
                if (iVar8 * -0x55555555 < 0) {
LAB_001ea11a:
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12e,"int Abc_Var2Lit(int, int)");
                }
                uVar12 = ((uint)(pGVar2 + iVar14) & 1) + iVar8 * 0x55555556;
              }
              else {
                pGVar6 = Gia_ManAppendObj(pGVar5);
                uVar10 = *(ulong *)pGVar6;
                *(ulong *)pGVar6 = uVar10 | 0x9fffffff;
                *(ulong *)pGVar6 =
                     uVar10 & 0xe0000000ffffffff | 0x9fffffff |
                     (ulong)(pGVar5->vCis->nSize & 0x1fffffff) << 0x20;
                pGVar2 = pGVar5->pObjs;
                if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_001ea09e;
                Vec_IntPush(pGVar5->vCis,
                            (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
                pGVar2 = pGVar5->pObjs;
                if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_001ea09e;
                uVar12 = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
              }
              pGVar1[iVar4].Value = uVar12;
              lVar15 = lVar15 + 1;
              pVVar7 = p1->vCis;
              uVar13 = (ulong)pVVar7->nSize;
              uVar10 = uVar13 - (long)p1->nRegs;
            } while (lVar15 < (long)uVar10);
          }
          iVar4 = p0->nRegs;
          if (0 < iVar4) {
            iVar14 = 0;
            do {
              iVar8 = p0->vCis->nSize;
              uVar12 = (iVar8 - iVar4) + iVar14;
              if (((int)uVar12 < 0) || (iVar8 <= (int)uVar12)) goto LAB_001ea0bd;
              iVar4 = p0->vCis->pArray[uVar12];
              if (((long)iVar4 < 0) || (p0->nObjs <= iVar4)) goto LAB_001ea07f;
              pGVar1 = p0->pObjs;
              if (pGVar1 == (Gia_Obj_t *)0x0) break;
              pGVar6 = Gia_ManAppendObj(pGVar5);
              uVar10 = *(ulong *)pGVar6;
              *(ulong *)pGVar6 = uVar10 | 0x9fffffff;
              *(ulong *)pGVar6 =
                   uVar10 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(pGVar5->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar2 = pGVar5->pObjs;
              if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_001ea09e;
              Vec_IntPush(pGVar5->vCis,
                          (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
              pGVar2 = pGVar5->pObjs;
              if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_001ea09e;
              pGVar1[iVar4].Value = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
              iVar14 = iVar14 + 1;
              iVar4 = p0->nRegs;
            } while (iVar14 < iVar4);
          }
          iVar4 = p1->nRegs;
          if (0 < iVar4) {
            iVar14 = 0;
            do {
              iVar8 = p1->vCis->nSize;
              uVar12 = (iVar8 - iVar4) + iVar14;
              if (((int)uVar12 < 0) || (iVar8 <= (int)uVar12)) goto LAB_001ea0bd;
              iVar4 = p1->vCis->pArray[uVar12];
              if (((long)iVar4 < 0) || (p1->nObjs <= iVar4)) goto LAB_001ea07f;
              pGVar1 = p1->pObjs;
              if (pGVar1 == (Gia_Obj_t *)0x0) break;
              pGVar6 = Gia_ManAppendObj(pGVar5);
              uVar10 = *(ulong *)pGVar6;
              *(ulong *)pGVar6 = uVar10 | 0x9fffffff;
              *(ulong *)pGVar6 =
                   uVar10 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(pGVar5->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar2 = pGVar5->pObjs;
              if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) {
LAB_001ea09e:
                __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
              }
              Vec_IntPush(pGVar5->vCis,
                          (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
              pGVar2 = pGVar5->pObjs;
              if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_001ea09e;
              pGVar1[iVar4].Value = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
              iVar14 = iVar14 + 1;
              iVar4 = p1->nRegs;
            } while (iVar14 < iVar4);
          }
          pVVar7 = p0->vCos;
          uVar10 = (ulong)(uint)pVVar7->nSize;
          if (p0->nRegs < pVVar7->nSize) {
            lVar15 = 0;
            do {
              if ((int)uVar10 <= lVar15) goto LAB_001ea0bd;
              iVar4 = pVVar7->pArray[lVar15];
              if (((long)iVar4 < 0) || (p0->nObjs <= iVar4)) goto LAB_001ea07f;
              if (p0->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar1 = p0->pObjs + iVar4;
              Gia_ManMiter_rec(pGVar5,p0,pGVar1 + -(ulong)((uint)*(ulong *)pGVar1 & 0x1fffffff));
              lVar11 = (long)p1->vCos->nSize;
              if (lVar11 - p1->nRegs <= lVar15) {
LAB_001ea0fb:
                __assert_fail("v < Gia_ManPoNum(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
              }
              if (lVar11 <= lVar15) goto LAB_001ea0bd;
              iVar4 = p1->vCos->pArray[lVar15];
              if (((long)iVar4 < 0) || (p1->nObjs <= iVar4)) goto LAB_001ea07f;
              Gia_ManMiter_rec(pGVar5,p1,
                               p1->pObjs + iVar4 + -(*(ulong *)(p1->pObjs + iVar4) & 0x1fffffff));
              uVar10 = *(ulong *)pGVar1;
              uVar12 = pGVar1[-(uVar10 & 0x1fffffff)].Value;
              if (fDualOut == 0) {
                if (fImplic == 0) {
                  if ((int)uVar12 < 0) goto LAB_001ea0dc;
                  lVar11 = (long)p1->vCos->nSize;
                  if (lVar11 - p1->nRegs <= lVar15) goto LAB_001ea0fb;
                  if (lVar11 <= lVar15) goto LAB_001ea0bd;
                  iVar4 = p1->vCos->pArray[lVar15];
                  if (((long)iVar4 < 0) || (p1->nObjs <= iVar4)) goto LAB_001ea07f;
                  uVar9 = (uint)*(undefined8 *)(p1->pObjs + iVar4);
                  uVar3 = (p1->pObjs + iVar4)[-(ulong)(uVar9 & 0x1fffffff)].Value;
                  if ((int)uVar3 < 0) goto LAB_001ea0dc;
                  uVar12 = Gia_ManHashXor(pGVar5,(uint)uVar10 >> 0x1d & 1 ^ uVar12,
                                          uVar9 >> 0x1d & 1 ^ uVar3);
                }
                else {
                  if ((int)uVar12 < 0) goto LAB_001ea0dc;
                  lVar11 = (long)p1->vCos->nSize;
                  if (lVar11 - p1->nRegs <= lVar15) goto LAB_001ea0fb;
                  if (lVar11 <= lVar15) goto LAB_001ea0bd;
                  iVar4 = p1->vCos->pArray[lVar15];
                  if (((long)iVar4 < 0) || (p1->nObjs <= iVar4)) goto LAB_001ea07f;
                  uVar9 = (uint)*(undefined8 *)(p1->pObjs + iVar4);
                  uVar3 = (p1->pObjs + iVar4)[-(ulong)(uVar9 & 0x1fffffff)].Value;
                  if ((int)uVar3 < 0) goto LAB_001ea0dc;
                  uVar12 = Gia_ManHashAnd(pGVar5,(uint)uVar10 >> 0x1d & 1 ^ uVar12,
                                          uVar3 ^ uVar9 >> 0x1d & 1 ^ 1);
                }
              }
              else {
                if ((int)uVar12 < 0) goto LAB_001ea0dc;
                Gia_ManAppendCo(pGVar5,(uint)(uVar10 >> 0x1d) & 1 ^ uVar12);
                lVar11 = (long)p1->vCos->nSize;
                if (lVar11 - p1->nRegs <= lVar15) goto LAB_001ea0fb;
                if (lVar11 <= lVar15) goto LAB_001ea0bd;
                iVar4 = p1->vCos->pArray[lVar15];
                if (((long)iVar4 < 0) || (p1->nObjs <= iVar4)) goto LAB_001ea07f;
                uVar3 = (uint)*(undefined8 *)(p1->pObjs + iVar4);
                uVar12 = (p1->pObjs + iVar4)[-(ulong)(uVar3 & 0x1fffffff)].Value;
                if ((int)uVar12 < 0) goto LAB_001ea0dc;
                uVar12 = uVar3 >> 0x1d & 1 ^ uVar12;
              }
              Gia_ManAppendCo(pGVar5,uVar12);
              lVar15 = lVar15 + 1;
              pVVar7 = p0->vCos;
              uVar10 = (ulong)pVVar7->nSize;
            } while (lVar15 < (long)(uVar10 - (long)p0->nRegs));
          }
          iVar4 = p0->nRegs;
          if (0 < iVar4) {
            iVar14 = 0;
            do {
              iVar8 = p0->vCos->nSize;
              uVar12 = (iVar8 - iVar4) + iVar14;
              if (((int)uVar12 < 0) || (iVar8 <= (int)uVar12)) goto LAB_001ea0bd;
              iVar4 = p0->vCos->pArray[uVar12];
              if (((long)iVar4 < 0) || (p0->nObjs <= iVar4)) goto LAB_001ea07f;
              if (p0->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar1 = p0->pObjs + iVar4;
              Gia_ManMiter_rec(pGVar5,p0,pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff));
              if ((int)pGVar1[-(*(ulong *)pGVar1 & 0x1fffffff)].Value < 0) goto LAB_001ea0dc;
              uVar12 = Gia_ManAppendCo(pGVar5,(uint)(*(ulong *)pGVar1 >> 0x1d) & 1 ^
                                              pGVar1[-(*(ulong *)pGVar1 & 0x1fffffff)].Value);
              pGVar1->Value = uVar12;
              iVar14 = iVar14 + 1;
              iVar4 = p0->nRegs;
            } while (iVar14 < iVar4);
          }
          iVar4 = p1->nRegs;
          if (0 < iVar4) {
            iVar14 = 0;
            do {
              iVar8 = p1->vCos->nSize;
              uVar12 = (iVar8 - iVar4) + iVar14;
              if (((int)uVar12 < 0) || (iVar8 <= (int)uVar12)) {
LAB_001ea0bd:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar8 = p1->vCos->pArray[uVar12];
              if (((long)iVar8 < 0) || (p1->nObjs <= iVar8)) {
LAB_001ea07f:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              if (p1->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar1 = p1->pObjs + iVar8;
              Gia_ManMiter_rec(pGVar5,p1,pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff));
              if ((int)pGVar1[-(*(ulong *)pGVar1 & 0x1fffffff)].Value < 0) {
LAB_001ea0dc:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x132,"int Abc_LitNotCond(int, int)");
              }
              uVar12 = Gia_ManAppendCo(pGVar5,(uint)(*(ulong *)pGVar1 >> 0x1d) & 1 ^
                                              pGVar1[-(*(ulong *)pGVar1 & 0x1fffffff)].Value);
              pGVar1->Value = uVar12;
              iVar14 = iVar14 + 1;
              iVar4 = p1->nRegs;
            } while (iVar14 < iVar4);
          }
          Gia_ManSetRegNum(pGVar5,iVar4 + p0->nRegs);
        }
        Gia_ManHashStop(pGVar5);
        p = Gia_ManCleanup(pGVar5);
        Gia_ManStop(pGVar5);
        pGVar5 = Gia_ManDupNormalize(p,0);
        Gia_ManStop(p);
        return pGVar5;
      }
      pcVar16 = "Gia_ManMiter(): Designs have different number of COs.";
    }
    else {
      pcVar16 = "Gia_ManMiter(): Designs have different number of CIs.";
    }
  }
  else {
    iVar14 = p0->nRegs;
    iVar8 = p1->nRegs;
    if (iVar4 - iVar14 == p1->vCis->nSize - iVar8) {
      if (p0->vCos->nSize - iVar14 == p1->vCos->nSize - iVar8) {
        if (iVar14 != 0 && iVar8 != 0) goto LAB_001e912d;
        pcVar16 = "Gia_ManMiter(): At least one of the designs has no registers.";
      }
      else {
        pcVar16 = "Gia_ManMiter(): Designs have different number of POs.";
      }
    }
    else {
      pcVar16 = "Gia_ManMiter(): Designs have different number of PIs.";
    }
  }
  puts(pcVar16);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManMiter( Gia_Man_t * p0, Gia_Man_t * p1, int nInsDup, int fDualOut, int fSeq, int fImplic, int fVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLit;
    if ( fSeq )
    {
        if ( Gia_ManPiNum(p0) != Gia_ManPiNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of PIs.\n" );
            return NULL;
        }
        if ( Gia_ManPoNum(p0) != Gia_ManPoNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of POs.\n" );
            return NULL;
        }
        if ( Gia_ManRegNum(p0) == 0 || Gia_ManRegNum(p1) == 0 )
        {
            printf( "Gia_ManMiter(): At least one of the designs has no registers.\n" );
            return NULL;
        }
    }
    else
    {
        if ( Gia_ManCiNum(p0) != Gia_ManCiNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of CIs.\n" );
            return NULL;
        }
        if ( Gia_ManCoNum(p0) != Gia_ManCoNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of COs.\n" );
            return NULL;
        }
    }
    // start the manager
    pNew = Gia_ManStart( Gia_ManObjNum(p0) + Gia_ManObjNum(p1) );
    pNew->pName = Abc_UtilStrsav( "miter" );
    // map combinational inputs
    Gia_ManFillValue( p0 );
    Gia_ManFillValue( p1 );
    Gia_ManConst0(p0)->Value = 0;
    Gia_ManConst0(p1)->Value = 0;
    // map internal nodes and outputs
    Gia_ManHashAlloc( pNew );
    if ( fSeq )
    {
        // create primary inputs
        Gia_ManForEachPi( p0, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachPi( p1, pObj, i )
            if ( i < Gia_ManPiNum(p1) - nInsDup )
                pObj->Value = Gia_ObjToLit( pNew, Gia_ManPi(pNew, i) );
            else
                pObj->Value = Gia_ManAppendCi( pNew );
        // create latch outputs
        Gia_ManForEachRo( p0, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRo( p1, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        // create primary outputs
        Gia_ManForEachPo( p0, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p0, Gia_ObjFanin0(pObj) );
            Gia_ManMiter_rec( pNew, p1, Gia_ObjFanin0(Gia_ManPo(p1,i)) );
            if ( fDualOut )
            {
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p1,i)) );
            }
            else if ( fImplic )
            {
                iLit = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Abc_LitNot(Gia_ObjFanin0Copy(Gia_ManPo(p1,i))) );
                Gia_ManAppendCo( pNew, iLit );
            }
            else 
            {
                iLit = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(Gia_ManPo(p1,i)) );
                Gia_ManAppendCo( pNew, iLit );
            }
        }
        // create register inputs
        Gia_ManForEachRi( p0, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p0, Gia_ObjFanin0(pObj) );
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
        Gia_ManForEachRi( p1, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p1, Gia_ObjFanin0(pObj) );
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p0) + Gia_ManRegNum(p1) );
    }
    else
    {
        // create combinational inputs
        Gia_ManForEachCi( p0, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachCi( p1, pObj, i )
            if ( i < Gia_ManCiNum(p1) - nInsDup )
                pObj->Value = Gia_ObjToLit( pNew, Gia_ManCi(pNew, i) );
            else
                pObj->Value = Gia_ManAppendCi( pNew );
        // create combinational outputs
        Gia_ManForEachCo( p0, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p0, Gia_ObjFanin0(pObj) );
            Gia_ManMiter_rec( pNew, p1, Gia_ObjFanin0(Gia_ManCo(p1,i)) );
            if ( fDualOut )
            {
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p1,i)) );
            }
            else if ( fImplic )
            {
                iLit = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Abc_LitNot(Gia_ObjFanin0Copy(Gia_ManPo(p1,i))) );
                Gia_ManAppendCo( pNew, iLit );
            }
            else
            {
                iLit = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(Gia_ManCo(p1,i)) );
                Gia_ManAppendCo( pNew, iLit );
            }
        }
    }
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );

    pNew = Gia_ManDupNormalize( pTemp = pNew, 0 );
    Gia_ManStop( pTemp );
    return pNew;
}